

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::ReserveResourceSignatures
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,PipelineStateCreateInfo *CreateInfo
          ,FixedLinearAllocator *MemPool)

{
  IPipelineResourceSignature *pSrcPtr;
  byte bVar1;
  uint uVar2;
  char (*in_RCX) [86];
  char (*Args_1) [51];
  char (*in_R8) [82];
  uint uVar3;
  string msg;
  char (*in_stack_ffffffffffffff88) [78];
  uint local_6c;
  string local_68;
  char local_48 [4];
  uint local_44;
  PipelineStateBase<Diligent::EngineVkImplTraits> *local_40;
  FixedLinearAllocator *local_38;
  
  if ((this->m_UsingImplicitSignature == true) &&
     (((byte *)CreateInfo->pInternalData == (byte *)0x0 || ((*CreateInfo->pInternalData & 1) == 0)))
     ) {
    if ((CreateInfo->ResourceSignaturesCount != 0) &&
       (CreateInfo->ppResourceSignatures != (IPipelineResourceSignature **)0x0)) {
      FormatString<char[26],char[86]>
                (&local_68,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "CreateInfo.ResourceSignaturesCount == 0 || CreateInfo.ppResourceSignatures == nullptr"
                 ,in_RCX);
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"ReserveResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4db);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
    this->m_SignatureCount = '\x01';
    bVar1 = 1;
    goto LAB_001fab0f;
  }
  local_38 = MemPool;
  if ((CreateInfo->ResourceSignaturesCount == 0) ||
     (CreateInfo->ppResourceSignatures == (IPipelineResourceSignature **)0x0)) {
    FormatString<char[26],char[85]>
              (&local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "CreateInfo.ResourceSignaturesCount > 0 && CreateInfo.ppResourceSignatures != nullptr"
               ,(char (*) [85])in_RCX);
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"ReserveResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x4e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    local_6c = 0;
    if (CreateInfo->ResourceSignaturesCount != 0) goto LAB_001fa934;
    uVar3 = 0;
  }
  else {
LAB_001fa934:
    local_6c = 0;
    uVar3 = 0;
    local_40 = this;
    do {
      Args_1 = (char (*) [51])CreateInfo->ppResourceSignatures;
      pSrcPtr = *(IPipelineResourceSignature **)(*Args_1 + (ulong)local_6c * 8);
      if (pSrcPtr == (IPipelineResourceSignature *)0x0) {
        FormatString<char[38],unsigned_int,char[82]>
                  (&local_68,(Diligent *)"Pipeline resource signature at index ",
                   (char (*) [38])&local_6c,
                   (uint *)
                   " is null. This error should\'ve been caught by ValidatePipelineResourceSignatures."
                   ,in_R8);
        Args_1 = (char (*) [51])0x4e5;
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"ReserveResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x4e5);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        CheckDynamicType<Diligent::PipelineResourceSignatureVkImpl,Diligent::IPipelineResourceSignature>
                  (pSrcPtr);
      }
      bVar1 = *(byte *)((long)&pSrcPtr[7].super_IDeviceObject.super_IObject._vptr_IObject + 4);
      if (7 < bVar1) {
        local_48[0] = '\a';
        local_48[1] = '\0';
        local_48[2] = '\0';
        local_48[3] = '\0';
        in_R8 = (char (*) [82])local_48;
        local_44 = (uint)bVar1;
        FormatString<char[53],unsigned_int,char[26],unsigned_int,char[78]>
                  (&local_68,(Diligent *)"Pipeline resource signature specifies binding index ",
                   (char (*) [53])&local_44,(uint *)" that exceeds the limit (",(char (*) [26])in_R8
                   ,(uint *)
                    "). This error should\'ve been caught by ValidatePipelineResourceSignatureDesc."
                   ,in_stack_ffffffffffffff88);
        Args_1 = (char (*) [51])0x4ea;
        DebugAssertionFailed
                  (local_68._M_dataplus._M_p,"ReserveResourceSignatures",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                   ,0x4ea);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68._M_dataplus._M_p != &local_68.field_2) {
          operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
        }
      }
      this = local_40;
      if (uVar3 <= bVar1) {
        uVar3 = (uint)bVar1;
      }
      local_6c = local_6c + 1;
    } while (local_6c < CreateInfo->ResourceSignaturesCount);
    if (7 < uVar3) {
      FormatString<char[26],char[51]>
                (&local_68,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"MaxSignatureBindingIndex < MAX_RESOURCE_SIGNATURES",Args_1);
      DebugAssertionFailed
                (local_68._M_dataplus._M_p,"ReserveResourceSignatures",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
                 ,0x4ee);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
  MemPool = local_38;
  bVar1 = (byte)(uVar3 + 1);
  this->m_SignatureCount = bVar1;
  uVar2 = uVar3 + 1 & 0xff;
  if (uVar3 + 1 != uVar2) {
    FormatString<char[26],char[49]>
              (&local_68,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_SignatureCount == MaxSignatureBindingIndex + 1",
               (char (*) [49])(ulong)uVar2);
    DebugAssertionFailed
              (local_68._M_dataplus._M_p,"ReserveResourceSignatures",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x4f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    bVar1 = this->m_SignatureCount;
  }
LAB_001fab0f:
  FixedLinearAllocator::AddSpace(MemPool,(ulong)bVar1 << 3,8);
  return;
}

Assistant:

void ReserveResourceSignatures(const PipelineStateCreateInfo& CreateInfo, FixedLinearAllocator& MemPool)
    {
        if (m_UsingImplicitSignature && (GetInternalCreateFlags(CreateInfo) & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) == 0)
        {
            VERIFY_EXPR(CreateInfo.ResourceSignaturesCount == 0 || CreateInfo.ppResourceSignatures == nullptr);
            m_SignatureCount = 1;
        }
        else
        {
            VERIFY_EXPR(CreateInfo.ResourceSignaturesCount > 0 && CreateInfo.ppResourceSignatures != nullptr);
            Uint32 MaxSignatureBindingIndex = 0;
            for (Uint32 i = 0; i < CreateInfo.ResourceSignaturesCount; ++i)
            {
                const PipelineResourceSignatureImplType* pSignature = ClassPtrCast<PipelineResourceSignatureImplType>(CreateInfo.ppResourceSignatures[i]);
                VERIFY(pSignature != nullptr, "Pipeline resource signature at index ", i, " is null. This error should've been caught by ValidatePipelineResourceSignatures.");

                Uint32 Index = pSignature->GetDesc().BindingIndex;
                VERIFY(Index < MAX_RESOURCE_SIGNATURES,
                       "Pipeline resource signature specifies binding index ", Uint32{Index}, " that exceeds the limit (", MAX_RESOURCE_SIGNATURES - 1,
                       "). This error should've been caught by ValidatePipelineResourceSignatureDesc.");

                MaxSignatureBindingIndex = std::max(MaxSignatureBindingIndex, Uint32{Index});
            }
            VERIFY_EXPR(MaxSignatureBindingIndex < MAX_RESOURCE_SIGNATURES);
            m_SignatureCount = static_cast<decltype(m_SignatureCount)>(MaxSignatureBindingIndex + 1);
            VERIFY_EXPR(m_SignatureCount == MaxSignatureBindingIndex + 1);
        }

        MemPool.AddSpace<SignatureAutoPtrType>(m_SignatureCount);
    }